

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Primer * __thiscall ASDCP::MXF::Primer::InitFromBuffer(Primer *this,byte_t *p,ui32_t l)

{
  bool bVar1;
  int iVar2;
  byte_t *value;
  ILogSink *pIVar3;
  h__PrimerLookup *phVar4;
  uint in_ECX;
  undefined4 in_register_00000014;
  Result_t local_140 [104];
  undefined1 local_d8 [8];
  MemIOReader MemRDR;
  UL local_b0;
  undefined1 local_90 [8];
  Result_t result;
  ui32_t l_local;
  byte_t *p_local;
  Primer *this_local;
  
  if (*(long *)(p + 200) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x1d4,
                  "virtual ASDCP::Result_t ASDCP::MXF::Primer::InitFromBuffer(const byte_t *, ui32_t)"
                 );
  }
  value = Dictionary::ul(*(Dictionary **)(p + 200),MDD_Primer);
  UL::UL(&local_b0,value);
  KLVPacket::InitFromBuffer((KLVPacket *)local_90,p,l,(UL *)(ulong)in_ECX);
  UL::~UL(&local_b0);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_90);
  if (-1 < iVar2) {
    if (CONCAT44(in_register_00000014,l) + (ulong)in_ECX <
        (ulong)(*(long *)(p + 0x18) + *(long *)(p + 0x20))) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"Primer entry too long.\n");
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00237954;
    }
    Kumu::MemIOReader::MemIOReader
              ((MemIOReader *)local_d8,*(byte_t **)(p + 0x18),*(ui32_t *)(p + 0x20));
    bVar1 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::
            Unarchive((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                       *)(p + 0x88),(MemIOReader *)local_d8);
    if (bVar1) {
      Kumu::Result_t::Result_t(local_140,(Result_t *)Kumu::RESULT_OK);
    }
    else {
      Kumu::Result_t::operator()((int *)local_140,ASDCP::RESULT_KLV_CODING);
    }
    Kumu::Result_t::operator=((Result_t *)local_90,local_140);
    Kumu::Result_t::~Result_t(local_140);
    Kumu::MemIOReader::~MemIOReader((MemIOReader *)local_d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_90);
  if (-1 < iVar2) {
    phVar4 = (h__PrimerLookup *)operator_new(0x30);
    h__PrimerLookup::h__PrimerLookup(phVar4);
    mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup>::operator=
              ((mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup> *)(p + 0x78),phVar4);
    phVar4 = mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup>::operator->
                       ((mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup> *)(p + 0x78));
    h__PrimerLookup::InitWithBatch(phVar4,(Batch<ASDCP::MXF::Primer::LocalTagEntry> *)(p + 0x88));
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_90);
  if (iVar2 < 0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Failed to initialize Primer.\n");
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_90);
LAB_00237954:
  MemRDR.m_size = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_90);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::InitFromBuffer(const byte_t* p, ui32_t l)
{
  assert(m_Dict);
  Result_t result = KLVPacket::InitFromBuffer(p, l, m_Dict->ul(MDD_Primer));

  if ( ASDCP_SUCCESS(result) )
    {
      if (m_ValueStart + m_ValueLength > p + l)
      {
        DefaultLogSink().Error("Primer entry too long.\n");
        return RESULT_KLV_CODING(__LINE__, __FILE__);
      }
      Kumu::MemIOReader MemRDR(m_ValueStart, m_ValueLength);
      result = LocalTagEntryBatch.Unarchive(&MemRDR) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      m_Lookup = new h__PrimerLookup;
      m_Lookup->InitWithBatch(LocalTagEntryBatch);
    }

  if ( ASDCP_FAILURE(result) )
    DefaultLogSink().Error("Failed to initialize Primer.\n");

  return result;
}